

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O0

int stbrp__skyline_find_min_y(stbrp_context *param_1,stbrp_node *first,int x0,int width,int *pwaste)

{
  int iVar1;
  int local_44;
  int local_40;
  int under_width;
  int waste_area;
  int visited_width;
  int min_y;
  int x1;
  stbrp_node *node;
  int *pwaste_local;
  int width_local;
  int x0_local;
  stbrp_node *first_local;
  stbrp_context *param_0_local;
  
  if (x0 < (int)(uint)first->x) {
    __assert_fail("first->x <= x0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_rect_pack.h"
                  ,0x115,
                  "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
  }
  if ((int)(uint)first->next->x <= x0) {
    __assert_fail("node->next->x > x0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_rect_pack.h"
                  ,0x11c,
                  "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
  }
  if (x0 < (int)(uint)first->x) {
    __assert_fail("node->x <= x0",
                  "/workspace/llm4binary/github/license_c_cmakelists/gwerners[P]BasicGLFWImgui/stb_rect_pack.h"
                  ,0x11f,
                  "int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *, int, int, int *)");
  }
  waste_area = 0;
  local_40 = 0;
  under_width = 0;
  for (_min_y = first; (int)(uint)_min_y->x < x0 + width; _min_y = _min_y->next) {
    if ((uint)waste_area < (uint)_min_y->y) {
      iVar1 = under_width * ((uint)_min_y->y - waste_area);
      waste_area = (int)_min_y->y;
      if ((int)(uint)_min_y->x < x0) {
        local_44 = (uint)_min_y->next->x - x0;
      }
      else {
        local_44 = (uint)_min_y->next->x - (uint)_min_y->x;
      }
    }
    else {
      local_44 = (uint)_min_y->next->x - (uint)_min_y->x;
      if (width < local_44 + under_width) {
        local_44 = width - under_width;
      }
      iVar1 = local_44 * (waste_area - (uint)_min_y->y);
    }
    under_width = local_44 + under_width;
    local_40 = iVar1 + local_40;
  }
  *pwaste = local_40;
  return waste_area;
}

Assistant:

static int stbrp__skyline_find_min_y(stbrp_context *, stbrp_node *first, int x0, int width, int *pwaste)
{
   //(void)c;
   stbrp_node *node = first;
   int x1 = x0 + width;
   int min_y, visited_width, waste_area;
   STBRP_ASSERT(first->x <= x0);

   #if 0
   // skip in case we're past the node
   while (node->next->x <= x0)
      ++node;
   #else
   STBRP_ASSERT(node->next->x > x0); // we ended up handling this in the caller for efficiency
   #endif

   STBRP_ASSERT(node->x <= x0);

   min_y = 0;
   waste_area = 0;
   visited_width = 0;
   while (node->x < x1) {
      if (node->y > min_y) {
         // raise min_y higher.
         // we've accounted for all waste up to min_y,
         // but we'll now add more waste for everything we've visted
         waste_area += visited_width * (node->y - min_y);
         min_y = node->y;
         // the first time through, visited_width might be reduced
         if (node->x < x0)
            visited_width += node->next->x - x0;
         else
            visited_width += node->next->x - node->x;
      } else {
         // add waste area
         int under_width = node->next->x - node->x;
         if (under_width + visited_width > width)
            under_width = width - visited_width;
         waste_area += under_width * (min_y - node->y);
         visited_width += under_width;
      }
      node = node->next;
   }

   *pwaste = waste_area;
   return min_y;
}